

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::AppendExternalFrameToStackTrace
               (CompoundString *bs,LPCWSTR functionName,LPCWSTR fileName,ULONG lineNumber,
               LONG characterPosition)

{
  errno_t eVar1;
  WCHAR local_438 [2];
  errno_t err;
  char16 ext [256];
  char16 shortfilename [256];
  LONG LStack_28;
  anon_class_1_0_00000001 ConvertULongToString;
  CharCount maxULongStringLength;
  LONG characterPosition_local;
  ULONG lineNumber_local;
  LPCWSTR fileName_local;
  LPCWSTR functionName_local;
  CompoundString *bs_local;
  
  LStack_28 = characterPosition;
  maxULongStringLength = lineNumber;
  _characterPosition_local = fileName;
  fileName_local = functionName;
  functionName_local = (LPCWSTR)bs;
  if ((DAT_01ec73d5 & 1) == 0) {
    CompoundString::AppendChars<8u>(bs,(char16 (*) [8])L"\n   at ",true);
  }
  else {
    CompoundString::AppendChars<6u>(bs,(char16 (*) [6])L"\n\tat ",true);
  }
  CompoundString::AppendCharsSz((CompoundString *)functionName_local,fileName_local);
  CompoundString::AppendChars<3u>
            ((CompoundString *)functionName_local,(char16 (*) [3])0x18a786c,true);
  if (((DAT_01ec73d5 & 1) == 0) || (*_characterPosition_local == L'\0')) {
    CompoundString::AppendCharsSz((CompoundString *)functionName_local,_characterPosition_local);
  }
  else {
    eVar1 = _wsplitpath_s(_characterPosition_local,(WCHAR *)0x0,0,(WCHAR *)0x0,0,ext + 0xfc,0x100,
                          local_438,0x100);
    if (eVar1 == 0) {
      CompoundString::AppendCharsSz((CompoundString *)functionName_local,ext + 0xfc);
      CompoundString::AppendCharsSz((CompoundString *)functionName_local,local_438);
    }
    else {
      CompoundString::AppendCharsSz((CompoundString *)functionName_local,_characterPosition_local);
    }
  }
  CompoundString::AppendChars((CompoundString *)functionName_local,L':');
  CompoundString::
  AppendChars<unsigned_int,Js::JavascriptExceptionOperators::AppendExternalFrameToStackTrace(Js::CompoundString*,char16_t_const*,char16_t_const*,unsigned_int,int)::__0>
            ((CompoundString *)functionName_local,&maxULongStringLength,10);
  CompoundString::AppendChars((CompoundString *)functionName_local,L':');
  CompoundString::
  AppendChars<int,Js::JavascriptExceptionOperators::AppendExternalFrameToStackTrace(Js::CompoundString*,char16_t_const*,char16_t_const*,unsigned_int,int)::__0>
            ((CompoundString *)functionName_local,&stack0xffffffffffffffd8,10);
  CompoundString::AppendChars((CompoundString *)functionName_local,L')');
  return;
}

Assistant:

void JavascriptExceptionOperators::AppendExternalFrameToStackTrace(CompoundString* bs, LPCWSTR functionName, LPCWSTR fileName, ULONG lineNumber, LONG characterPosition)
    {
        // format is equivalent to wprintf("\n   at %s (%s:%d:%d)", functionName, filename, lineNumber, characterPosition);

        const CharCount maxULongStringLength = 10; // excluding null terminator
        const auto ConvertULongToString = [](const ULONG value, char16 *const buffer, const CharCount charCapacity)
        {
            const errno_t err = _ultow_s(value, buffer, charCapacity, 10);
            Assert(err == 0);
        };
        if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
        {
            bs->AppendChars(_u("\n\tat "));
        }
        else
        {
            bs->AppendChars(_u("\n   at "));
        }
        bs->AppendCharsSz(functionName);
        bs->AppendChars(_u(" ("));

        if (CONFIG_FLAG(ExtendedErrorStackForTestHost) && *fileName != _u('\0'))
        {
            char16 shortfilename[_MAX_FNAME];
            char16 ext[_MAX_EXT];
            errno_t err = _wsplitpath_s(fileName, NULL, 0, NULL, 0, shortfilename, _MAX_FNAME, ext, _MAX_EXT);
            if (err != 0)
            {
                bs->AppendCharsSz(fileName);
            }
            else
            {
                bs->AppendCharsSz(shortfilename);
                bs->AppendCharsSz(ext);
            }
        }
        else
        {
            bs->AppendCharsSz(fileName);
        }
        bs->AppendChars(_u(':'));
        bs->AppendChars(lineNumber, maxULongStringLength, ConvertULongToString);
        bs->AppendChars(_u(':'));
        bs->AppendChars(characterPosition, maxULongStringLength, ConvertULongToString);
        bs->AppendChars(_u(')'));
    }